

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void ra_to_uint32_array(roaring_array_t *ra,uint32_t *ans)

{
  int iVar1;
  long lVar2;
  int32_t i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < ra->size; lVar3 = lVar3 + 1) {
    iVar1 = container_to_uint32_array
                      (ans + lVar2,ra->containers[lVar3],ra->typecodes[lVar3],
                       (uint)ra->keys[lVar3] << 0x10);
    lVar2 = lVar2 + iVar1;
  }
  return;
}

Assistant:

void ra_to_uint32_array(const roaring_array_t *ra, uint32_t *ans) {
    size_t ctr = 0;
    for (int32_t i = 0; i < ra->size; ++i) {
        int num_added = container_to_uint32_array(
            ans + ctr, ra->containers[i], ra->typecodes[i],
            ((uint32_t)ra->keys[i]) << 16);
        ctr += num_added;
    }
}